

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O0

int isWellFormed(ltlNode *topNode)

{
  ltlNode_t *plVar1;
  int iVar2;
  bool local_29;
  ltlNode *nextNode;
  ltlNode *topNode_local;
  
  switch(topNode->type) {
  case AND:
  case OR:
  case IMPLY:
    iVar2 = isWellFormed(topNode->left);
    local_29 = false;
    if (iVar2 != 0) {
      iVar2 = isWellFormed(topNode->right);
      local_29 = iVar2 != 0;
    }
    topNode_local._4_4_ = (uint)local_29;
    break;
  case NOT:
    if (topNode->right != (ltlNode_t *)0x0) {
      __assert_fail("topNode->right == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x29f,"int isWellFormed(ltlNode *)");
    }
    topNode_local._4_4_ = isWellFormed(topNode->left);
    break;
  case GLOBALLY:
    plVar1 = topNode->left;
    if (topNode->right != (ltlNode_t *)0x0) {
      __assert_fail("topNode->right == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x2a5,"int isWellFormed(ltlNode *)");
    }
    if (plVar1->type == EVENTUALLY) {
      if (plVar1->right != (ltlNode_t *)0x0) {
        __assert_fail("nextNode->right == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                      ,0x2aa,"int isWellFormed(ltlNode *)");
      }
      topNode_local._4_4_ = isNonTemporalSubformula(plVar1->left);
    }
    else {
      topNode_local._4_4_ = 0;
    }
    break;
  default:
    topNode_local._4_4_ = 0;
    break;
  case BOOL:
    topNode_local._4_4_ = 1;
  }
  return topNode_local._4_4_;
}

Assistant:

int isWellFormed( ltlNode *topNode )
{
    ltlNode *nextNode;

    switch( topNode->type ){
        case AND:
        case OR:
        case IMPLY:
            return isWellFormed( topNode->left) && isWellFormed( topNode->right ) ;
        case NOT:
            assert( topNode->right == NULL );
            return isWellFormed( topNode->left );
        case BOOL:
            return 1;
        case GLOBALLY:
            nextNode = topNode->left;
            assert( topNode->right == NULL );
            if( nextNode->type != EVENTUALLY )
                return 0;
            else
            {
                assert( nextNode->right == NULL );
                return isNonTemporalSubformula( nextNode->left );
            }
        default:
            return 0;
    }
}